

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar2;
  pointer pcVar3;
  cmGeneratorTarget *this_01;
  _Base_ptr p_Var4;
  cmComputeLinkDepends *this_02;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string *psVar7;
  cmLinkInterface *iface;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pLVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar9;
  size_t index;
  bool local_9a;
  bool local_99;
  _Base_ptr local_98;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  cmComputeLinkDepends *local_70;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  pVar9 = AllocateLinkEntry(this,&dep->Item);
  local_98 = pVar9.first._M_node._M_node[4]._M_parent;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pLVar8 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)local_98;
    psVar7 = cmLinkItem::AsStr_abi_cxx11_(&dep->Item);
    pcVar1 = (psVar7->_M_dataplus)._M_p;
    local_90 = (element_type *)&local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + psVar7->_M_string_length);
    local_48 = (dep->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_40 = (dep->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
      }
    }
    if (local_90 == (element_type *)&local_80) {
      local_58._8_8_ = uStack_78;
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_58;
    }
    else {
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_90;
    }
    local_58._1_7_ = uStack_7f;
    local_58[0] = local_80;
    local_68.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_88;
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80 = 0;
    local_90 = (element_type *)&local_80;
    std::__cxx11::string::operator=((string *)pLVar8,(string *)&local_68);
    p_Var6 = p_Stack_40;
    peVar5 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pLVar8->Item).Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
    (pLVar8->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar5;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(pLVar8->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8)
    )->_M_pi = p_Var6;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
    }
    if (local_68.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)local_58) {
      operator_delete(local_68.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_58._0_8_ + 1);
    }
    if (local_90 != (element_type *)&local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
    pLVar8->Target = (dep->Item).Target;
    pLVar8->Kind = SharedDep;
  }
  p_Var4 = local_98;
  sVar2 = dep->DependerIndex;
  pcVar3 = (this->EntryConstraintGraph).
           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar8 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_99 = true;
  local_9a = false;
  local_68.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = this;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_68);
  std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
  emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
            ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar3 + sVar2),
             (unsigned_long *)&local_98,&local_99,&local_9a,(cmListFileBacktrace *)&local_68);
  if (local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  this_02 = local_70;
  this_01 = pLVar8[(long)p_Var4].Target;
  if (this_01 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_01,&local_70->Config,local_70->Target);
    if (iface != (cmLinkInterface *)0x0) {
      FollowSharedDeps(this_02,(size_t)local_98,iface,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(dep.Item);
  size_t index = lei.first->second;

  // Check if the target does not already has an entry.
  if (lei.second) {
    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[index];
    entry.Item = BT<std::string>(dep.Item.AsStr(), dep.Item.Backtrace);
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.Kind = LinkEntry::SharedDep;
  }

  // Get the link entry for this target.
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].emplace_back(
    index, true, false, cmListFileBacktrace());

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}